

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_13f457::CompressorState::process
          (CompressorState *this,size_t samplesToDo,
          span<const_std::array<float,_1024UL>,_18446744073709551615UL> samplesIn,
          span<std::array<float,_1024UL>,_18446744073709551615UL> samplesOut)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  float *pfVar4;
  pointer paVar5;
  pointer paVar6;
  ulong uVar7;
  pointer paVar8;
  float *pfVar9;
  pointer paVar10;
  long lVar11;
  size_t sVar12;
  float (*pafVar13) [16];
  float (*pafVar14) [16];
  float fVar15;
  float fVar16;
  float fVar17;
  float afStack_438 [258];
  
  paVar6 = samplesIn.mData;
  paVar10 = samplesOut.mData;
  if (samplesToDo != 0) {
    bVar3 = this->mEnabled;
    sVar12 = 0;
    do {
      uVar7 = samplesToDo - sVar12;
      if (0xff < uVar7) {
        uVar7 = 0x100;
      }
      fVar16 = this->mEnvFollower;
      if (bVar3 == false) {
        if (samplesToDo != sVar12) {
          fVar1 = this->mAttackMult;
          fVar2 = this->mReleaseMult;
          lVar11 = 0;
          do {
            if (1.0 <= fVar16) {
              if ((1.0 < fVar16) && (fVar16 = fVar16 * fVar2, fVar16 <= 1.0)) {
                fVar16 = 1.0;
              }
            }
            else {
              fVar17 = fVar16 * fVar1;
              fVar16 = 1.0;
              if (fVar17 <= 1.0) {
                fVar16 = fVar17;
              }
            }
            afStack_438[lVar11] = 1.0 / fVar16;
            lVar11 = lVar11 + 1;
          } while (uVar7 + (uVar7 == 0) != lVar11);
        }
      }
      else if (samplesToDo != sVar12) {
        fVar1 = this->mAttackMult;
        fVar2 = this->mReleaseMult;
        lVar11 = 0;
        do {
          fVar17 = 0.5;
          if (0.5 <= ABS(paVar6->_M_elems[sVar12 + lVar11])) {
            fVar17 = ABS(paVar6->_M_elems[sVar12 + lVar11]);
          }
          if (2.0 <= fVar17) {
            fVar17 = 2.0;
          }
          if (fVar17 <= fVar16) {
            if ((fVar17 < fVar16) && (fVar16 = fVar16 * fVar2, fVar16 <= fVar17)) {
              fVar16 = fVar17;
            }
          }
          else {
            fVar15 = fVar16 * fVar1;
            fVar16 = fVar17;
            if (fVar15 <= fVar17) {
              fVar16 = fVar15;
            }
          }
          afStack_438[lVar11] = 1.0 / fVar16;
          lVar11 = lVar11 + 1;
        } while (uVar7 + (uVar7 == 0) != lVar11);
      }
      this->mEnvFollower = fVar16;
      if (paVar6 != samplesIn.mDataEnd) {
        pfVar9 = paVar6->_M_elems + sVar12;
        pfVar4 = paVar10->_M_elems + sVar12;
        paVar5 = paVar10;
        pafVar14 = this->mGain;
        pafVar13 = this->mGain;
        paVar8 = paVar6;
        do {
          for (; paVar5 != samplesOut.mDataEnd; paVar5 = paVar5 + 1) {
            fVar16 = (*pafVar14)[0];
            if (1e-05 < ABS(fVar16) && samplesToDo != sVar12) {
              lVar11 = 0;
              do {
                pfVar4[lVar11] = pfVar9[lVar11] * afStack_438[lVar11] * fVar16 + pfVar4[lVar11];
                lVar11 = lVar11 + 1;
              } while (uVar7 + (uVar7 == 0) != lVar11);
            }
            pfVar4 = pfVar4 + 0x400;
            pafVar14 = (float (*) [16])(*pafVar14 + 1);
          }
          pafVar14 = pafVar13 + 1;
          paVar8 = paVar8 + 1;
          pfVar9 = pfVar9 + 0x400;
          pfVar4 = paVar10->_M_elems + sVar12;
          paVar5 = paVar10;
          pafVar13 = pafVar14;
        } while (paVar8 != samplesIn.mDataEnd);
      }
      sVar12 = sVar12 + uVar7;
    } while (sVar12 < samplesToDo);
  }
  return;
}

Assistant:

void CompressorState::process(const size_t samplesToDo,
    const al::span<const FloatBufferLine> samplesIn, const al::span<FloatBufferLine> samplesOut)
{
    for(size_t base{0u};base < samplesToDo;)
    {
        float gains[256];
        const size_t td{minz(256, samplesToDo-base)};

        /* Generate the per-sample gains from the signal envelope. */
        float env{mEnvFollower};
        if(mEnabled)
        {
            for(size_t i{0u};i < td;++i)
            {
                /* Clamp the absolute amplitude to the defined envelope limits,
                 * then attack or release the envelope to reach it.
                 */
                const float amplitude{clampf(std::fabs(samplesIn[0][base+i]), AMP_ENVELOPE_MIN,
                    AMP_ENVELOPE_MAX)};
                if(amplitude > env)
                    env = minf(env*mAttackMult, amplitude);
                else if(amplitude < env)
                    env = maxf(env*mReleaseMult, amplitude);

                /* Apply the reciprocal of the envelope to normalize the volume
                 * (compress the dynamic range).
                 */
                gains[i] = 1.0f / env;
            }
        }
        else
        {
            /* Same as above, except the amplitude is forced to 1. This helps
             * ensure smooth gain changes when the compressor is turned on and
             * off.
             */
            for(size_t i{0u};i < td;++i)
            {
                const float amplitude{1.0f};
                if(amplitude > env)
                    env = minf(env*mAttackMult, amplitude);
                else if(amplitude < env)
                    env = maxf(env*mReleaseMult, amplitude);

                gains[i] = 1.0f / env;
            }
        }
        mEnvFollower = env;

        /* Now compress the signal amplitude to output. */
        auto changains = std::addressof(mGain[0]);
        for(const auto &input : samplesIn)
        {
            const float *outgains{*(changains++)};
            for(FloatBufferLine &output : samplesOut)
            {
                const float gain{*(outgains++)};
                if(!(std::fabs(gain) > GainSilenceThreshold))
                    continue;

                for(size_t i{0u};i < td;i++)
                    output[base+i] += input[base+i] * gains[i] * gain;
            }
        }

        base += td;
    }
}